

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O2

void __thiscall
irr::core::array<irr::video::SMaterial>::reallocate
          (array<irr::video::SMaterial> *this,u32 new_size,bool canShrink)

{
  ulong __n;
  
  __n = (ulong)new_size;
  if ((ulong)(((long)(this->m_data).
                     super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)(this->m_data).
                    super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xb8) <= __n) {
    ::std::vector<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>::reserve
              (&this->m_data,__n);
    return;
  }
  if (!canShrink) {
    return;
  }
  ::std::vector<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>::resize
            (&this->m_data,__n);
  return;
}

Assistant:

void reallocate(u32 new_size, bool canShrink = true)
	{
		size_t allocated = m_data.capacity();
		if (new_size < allocated) {
			if (canShrink)
				m_data.resize(new_size);
		} else {
			m_data.reserve(new_size);
		}
	}